

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void libtorrent::aux::anon_unknown_119::on_dht_put_mutable_item
               (alert_manager *alerts,item *i,int num)

{
  bool bVar1;
  signature *psVar2;
  public_key *ppVar3;
  string *psVar4;
  undefined1 local_b0 [8];
  string salt;
  sequence_number seq;
  public_key pk;
  signature sig;
  int local_1c;
  item *piStack_18;
  int num_local;
  item *i_local;
  alert_manager *alerts_local;
  
  local_1c = num;
  piStack_18 = i;
  i_local = (item *)alerts;
  bVar1 = alert_manager::should_post<libtorrent::dht_put_alert>(alerts);
  if (bVar1) {
    psVar2 = libtorrent::dht::item::sig(piStack_18);
    pk.bytes._M_elems._24_8_ = *(undefined8 *)(psVar2->bytes)._M_elems;
    ppVar3 = libtorrent::dht::item::pk(piStack_18);
    seq.value = *(int64_t *)(ppVar3->bytes)._M_elems;
    pk.bytes._M_elems._0_8_ = *(undefined8 *)((ppVar3->bytes)._M_elems + 8);
    pk.bytes._M_elems._8_8_ = *(undefined8 *)((ppVar3->bytes)._M_elems + 0x10);
    pk.bytes._M_elems._16_8_ = *(undefined8 *)((ppVar3->bytes)._M_elems + 0x18);
    salt.field_2._8_8_ = libtorrent::dht::item::seq(piStack_18);
    psVar4 = libtorrent::dht::item::salt_abi_cxx11_(piStack_18);
    ::std::__cxx11::string::string((string *)local_b0,(string *)psVar4);
    alert_manager::
    emplace_alert<libtorrent::dht_put_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
              ((alert_manager *)i_local,(array<char,_32UL> *)&seq,
               (array<char,_64UL> *)(pk.bytes._M_elems + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (long *)(salt.field_2._M_local_buf + 8),&local_1c);
    ::std::__cxx11::string::~string((string *)local_b0);
  }
  return;
}

Assistant:

void on_dht_put_mutable_item(aux::alert_manager& alerts, dht::item const& i, int num)
		{
			if (alerts.should_post<dht_put_alert>())
			{
				dht::signature const sig = i.sig();
				dht::public_key const pk = i.pk();
				dht::sequence_number const seq = i.seq();
				std::string salt = i.salt();
				alerts.emplace_alert<dht_put_alert>(pk.bytes, sig.bytes
					, std::move(salt), seq.value, num);
			}
		}